

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O0

bool __thiscall
cmm::CMMParser::parseConstantExpression
          (CMMParser *this,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res)

{
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *this_00;
  bool Value;
  TokenKind TVar1;
  int Value_00;
  DoubleAST *this_01;
  pointer pEVar2;
  StringAST *this_02;
  string *Value_01;
  double Value_02;
  allocator local_41;
  string local_40;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *local_20;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res_local;
  CMMParser *this_local;
  
  local_20 = Res;
  Res_local = (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)this;
  TVar1 = getKind(this);
  this_00 = local_20;
  switch(TVar1) {
  case String:
    this_02 = (StringAST *)operator_new(0x30);
    Value_01 = CMMLexer::getStrVal_abi_cxx11_(&this->Lexer);
    StringAST::StringAST(this_02,Value_01);
    std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::reset
              (this_00,(pointer)this_02);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"unknown token in literal constant expression",&local_41);
    this_local._7_1_ = Error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    goto LAB_0011070d;
  case Integer:
    pEVar2 = (pointer)operator_new(0x10);
    Value_00 = CMMLexer::getIntVal(&this->Lexer);
    IntAST::IntAST((IntAST *)pEVar2,Value_00);
    std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::reset
              (this_00,pEVar2);
    break;
  case Double:
    this_01 = (DoubleAST *)operator_new(0x18);
    Value_02 = CMMLexer::getDoubleVal(&this->Lexer);
    DoubleAST::DoubleAST(this_01,Value_02);
    std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::reset
              (this_00,(pointer)this_01);
    break;
  case Boolean:
    pEVar2 = (pointer)operator_new(0x10);
    Value = CMMLexer::getBoolVal(&this->Lexer);
    BoolAST::BoolAST((BoolAST *)pEVar2,Value);
    std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::reset
              (this_00,pEVar2);
  }
  Lex(this);
  this_local._7_1_ = 0;
LAB_0011070d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CMMParser::parseConstantExpression(std::unique_ptr<ExpressionAST> &Res) {
  switch (getKind()) {
  default:  return Error("unknown token in literal constant expression");
  case Token::Integer:  Res.reset(new IntAST(Lexer.getIntVal())); break;
  case Token::Double:   Res.reset(new DoubleAST(Lexer.getDoubleVal())); break;
  case Token::Boolean:  Res.reset(new BoolAST(Lexer.getBoolVal())); break;
  case Token::String:   Res.reset(new StringAST(Lexer.getStrVal())); break;
  }
  Lex(); // eat the string,bool,int,double.
  return false;
}